

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model_parameters.cc
# Opt level: O3

void __thiscall xLearn::Model::SerializeToTXT(Model *this,string *filename)

{
  undefined1 auVar1 [16];
  int iVar2;
  uint uVar3;
  ostream *poVar4;
  int iVar5;
  float *pfVar6;
  uint uVar7;
  ulong uVar8;
  ulong uVar9;
  float *pfVar10;
  undefined1 auVar11 [16];
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM1_Qb;
  ofstream o_file;
  Logger local_264;
  ulong local_260;
  ulong local_258;
  string local_250;
  undefined1 local_230 [16];
  char local_220 [232];
  ios_base local_138 [264];
  
  if (filename->_M_string_length != 0) {
    std::ofstream::ofstream((ostream *)local_230,(string *)filename,_S_out);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_230,"bias: ",6);
    poVar4 = std::ostream::_M_insert<double>((double)*this->param_b_);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
    if (this->param_num_w_ != 0) {
      uVar8 = 0;
      do {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_230,"i_",2);
        poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)local_230);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,": ",2);
        poVar4 = std::ostream::_M_insert<double>((double)this->param_w_[uVar8]);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
        uVar7 = (int)uVar8 + this->aux_size_;
        uVar8 = (ulong)uVar7;
      } while (uVar7 < this->param_num_w_);
    }
    iVar2 = std::__cxx11::string::compare((char *)this);
    if ((iVar2 == 0) && (this->num_feat_ != 0)) {
      auVar11._8_8_ = in_XMM1_Qb;
      auVar11._0_8_ = in_XMM1_Qa;
      auVar11 = vcvtusi2ss_avx512f(auVar11,this->num_K_);
      pfVar6 = this->param_v_;
      uVar8 = 0;
      auVar11 = ZEXT416((uint)(auVar11._0_4_ * 0.25));
      auVar11 = vroundss_avx(auVar11,auVar11,10);
      iVar2 = vcvttss2usi_avx512f(auVar11);
      do {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_230,"v_",2);
        poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)local_230);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,": ",2);
        if (this->num_K_ != 0) {
          uVar7 = 0;
          do {
            std::ostream::_M_insert<double>((double)*pfVar6);
            uVar3 = this->num_K_;
            if (uVar7 != uVar3 - 1) {
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_230," ",1);
              uVar3 = this->num_K_;
            }
            uVar7 = uVar7 + 1;
            pfVar6 = pfVar6 + 1;
          } while (uVar7 < uVar3);
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_230,"\n",1);
        uVar8 = uVar8 + 1;
        pfVar6 = pfVar6 + (this->aux_size_ * iVar2 * 4 - this->num_K_);
      } while (uVar8 < this->num_feat_);
    }
    iVar2 = std::__cxx11::string::compare((char *)this);
    if (iVar2 == 0) {
      uVar7 = this->num_feat_;
      if (uVar7 != 0) {
        auVar1._8_8_ = in_XMM1_Qb;
        auVar1._0_8_ = in_XMM1_Qa;
        auVar11 = vcvtusi2ss_avx512f(auVar1,this->num_K_);
        pfVar6 = this->param_v_;
        local_260 = 0;
        auVar11 = ZEXT416((uint)(auVar11._0_4_ * 0.25));
        auVar11 = vroundss_avx(auVar11,auVar11,10);
        iVar2 = vcvttss2usi_avx512f(auVar11);
        uVar8 = (ulong)this->num_field_;
        do {
          if ((int)uVar8 == 0) {
            uVar8 = 0;
          }
          else {
            uVar9 = 0;
            do {
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_230,"v_",2);
              poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)local_230);
              std::__ostream_insert<char,std::char_traits<char>>(poVar4,"_",1);
              poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
              std::__ostream_insert<char,std::char_traits<char>>(poVar4,": ",2);
              if (iVar2 << 2 != 0) {
                uVar7 = 0;
                local_258 = uVar9;
                do {
                  uVar3 = uVar7 + 4;
                  iVar5 = 0;
                  pfVar10 = pfVar6;
                  do {
                    if (uVar7 + iVar5 < this->num_K_) {
                      std::ostream::_M_insert<double>((double)*pfVar10);
                      if (uVar7 + iVar5 != this->num_K_ - 1) {
                        std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)local_230," ",1);
                      }
                    }
                    pfVar10 = pfVar10 + 1;
                    iVar5 = iVar5 + 1;
                  } while (iVar5 != 4);
                  pfVar6 = pfVar10 + (this->aux_size_ * 4 - 4);
                  uVar7 = uVar3;
                } while (uVar3 < (uint)(iVar2 << 2));
                pfVar6 = pfVar10 + (this->aux_size_ * 4 - 4);
                uVar9 = local_258;
              }
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_230,"\n",1);
              uVar8 = (ulong)this->num_field_;
              uVar9 = uVar9 + 1;
            } while (uVar9 < uVar8);
            uVar7 = this->num_feat_;
          }
          local_260 = local_260 + 1;
        } while (local_260 < uVar7);
      }
    }
    local_230._0_8_ = _VTT;
    *(undefined8 *)(local_230 + *(long *)(_VTT + -0x18)) = ___throw_bad_array_new_length;
    std::filebuf::~filebuf((filebuf *)(local_230 + 8));
    std::ios_base::~ios_base(local_138);
    return;
  }
  local_230._0_8_ = local_220;
  local_264.severity_ = ERR;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_230,
             "/workspace/llm4binary/github/license_c_cmakelists/aksnzhy[P]xlearn/src/data/model_parameters.cc"
             ,"");
  local_250._M_dataplus._M_p = (pointer)&local_250.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_250,"SerializeToTXT","");
  poVar4 = Logger::Start(ERR,(string *)local_230,0xef,&local_250);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"CHECK_NE failed ",0x10);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar4,
             "/workspace/llm4binary/github/license_c_cmakelists/aksnzhy[P]xlearn/src/data/model_parameters.cc"
             ,0x5f);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,":",1);
  poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,0xef);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"filename.empty()",0x10);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4," = ",3);
  poVar4 = std::ostream::_M_insert<bool>(SUB81(poVar4,0));
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"true",4);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4," = ",3);
  poVar4 = std::ostream::_M_insert<bool>(SUB81(poVar4,0));
  std::operator<<(poVar4,"\n");
  std::__cxx11::string::~string((string *)&local_250);
  std::__cxx11::string::~string((string *)local_230);
  Logger::~Logger(&local_264);
  abort();
}

Assistant:

void Model::SerializeToTXT(const std::string& filename) {
  CHECK_NE(filename.empty(), true);
  std::ofstream o_file(filename);
  /*********************************************************
   *  Write linear and bias term                      *
   *********************************************************/
  // bias term
  o_file << "bias: " << param_b_[0] << "\n";
  // linear term
  index_t idx = 0;
  for (index_t i = 0; i < param_num_w_; i += aux_size_) {
    o_file << "i_" << idx << ": " << param_w_[i] << "\n";
    idx++;
  }
  /*********************************************************
   *  Write latent factor for fm                      *
   *********************************************************/
  if (score_func_.compare("fm") == 0) {
    index_t k_aligned = get_aligned_k();
    real_t* w = param_v_;
    for (index_t j = 0; j < num_feat_; ++j) {
      o_file << "v_" << j << ": ";
      for(index_t d = 0; d < num_K_; d++, w++) {
        o_file << *w;
        if (d != num_K_-1) {
          o_file << " ";
        }
      }
      o_file << "\n";
      // skip the rest parameters
      index_t skip = aux_size_*k_aligned-num_K_;
      w += skip;
    }
  }
  /*********************************************************
   *  Write latent factor for ffm                     *
   *********************************************************/
  if (score_func_.compare("ffm") == 0) {
    index_t k_aligned = get_aligned_k();
    real_t* w = param_v_;
    for (index_t j = 0; j < num_feat_; ++j) {
      for (index_t f = 0; f < num_field_; ++f) {
        o_file << "v_" << j << "_" << f << ": ";
        for (index_t d = 0; d < k_aligned; ) {
          for (index_t s = 0; s < kAlign; s++, w++, d++) {
            if (d < num_K_) {
              o_file << w[0];
              if (d != num_K_-1) {
                o_file << " ";
              }
            }
          }
          w += (aux_size_-1) * kAlign;
        }
        o_file << "\n";
      }
    }
  }
}